

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  Json *pJVar2;
  Value *root;
  bool value_00;
  char *value_01;
  LargestUInt value_02;
  char *value_03;
  LargestInt value_04;
  pointer key;
  double value_05;
  Members members;
  allocator local_69;
  string local_68;
  Members local_48;
  
  switch(value->field_0x8) {
  case 0:
    std::__cxx11::string::string((string *)&local_68,"null",(allocator *)&local_48);
    pushValue(this,&local_68);
    break;
  case 1:
    pJVar2 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar2,value_04);
    pushValue(this,&local_68);
    break;
  case 2:
    pJVar2 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar2,value_02);
    pushValue(this,&local_68);
    break;
  case 3:
    value_05 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)value,value_05);
    pushValue(this,&local_68);
    break;
  case 4:
    pJVar2 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar2,value_01);
    pushValue(this,&local_68);
    break;
  case 5:
    bVar1 = Value::asBool(value);
    valueToString_abi_cxx11_(&local_68,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&local_68);
    break;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&local_68,"{}",&local_69);
      pushValue(this,&local_68);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,"{",&local_69);
      writeWithIndent(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      indent(this);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(key->_M_dataplus)._M_p,value_03);
        writeWithIndent(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::append((char *)&this->document_);
        writeValue(this,root);
        key = key + 1;
        if (key == local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__cxx11::string::append((char *)&this->document_);
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      std::__cxx11::string::string((string *)&local_68,"}",&local_69);
      writeWithIndent(this,&local_68);
    }
    std::__cxx11::string::~string((string *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_00113174_default;
  }
  std::__cxx11::string::~string((string *)&local_68);
switchD_00113174_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }